

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O3

int abuf_memcpy_prepend(autobuf *autobuf,void *p,size_t len)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = 0;
  if (len != 0 && autobuf != (autobuf *)0x0) {
    iVar1 = _autobuf_enlarge(autobuf,autobuf->_len + len);
    if (iVar1 < 0) {
      iVar1 = -1;
    }
    else {
      memmove(autobuf->_buf + len,autobuf->_buf,autobuf->_len);
      memcpy(autobuf->_buf,p,len);
      sVar2 = len + autobuf->_len;
      autobuf->_len = sVar2;
      autobuf->_buf[sVar2] = '\0';
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
abuf_memcpy_prepend(struct autobuf *autobuf, const void *p, const size_t len) {
  if (autobuf == NULL || len == 0)
    return 0;

  if (_autobuf_enlarge(autobuf, autobuf->_len + len) < 0) {
    return -1;
  }
  memmove(&autobuf->_buf[len], autobuf->_buf, autobuf->_len);
  memcpy(autobuf->_buf, p, len);
  autobuf->_len += len;

  /* null-terminate autobuf */
  autobuf->_buf[autobuf->_len] = 0;

  return 0;
}